

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_dest(REF_AGENTS ref_agents,REF_INT id,REF_INT *dest)

{
  REF_INT RVar1;
  long lVar2;
  undefined8 in_R9;
  
  *dest = -1;
  lVar2 = (long)id * 0x68;
  switch(*(undefined4 *)((long)ref_agents + lVar2)) {
  case 0:
  case 7:
  case 8:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x107,
           "ref_agents_dest","has no dest",in_R9,0);
    return 1;
  case 1:
  case 3:
    RVar1 = *(REF_INT *)((long)ref_agents + lVar2 + 0x14);
    break;
  case 2:
  case 4:
  case 5:
  case 6:
    RVar1 = *(REF_INT *)((long)ref_agents + lVar2 + 0xc);
    break;
  default:
    return 0;
  }
  *dest = RVar1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_agents_dest(REF_AGENTS ref_agents, REF_INT id,
                                          REF_INT *dest) {
  *dest = REF_EMPTY;
  switch (ref_agent_mode(ref_agents, id)) {
    case REF_AGENT_WALKING:
      *dest = ref_agent_part(ref_agents, id);
      break;
    case REF_AGENT_AT_BOUNDARY:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_HOP_PART:
      *dest = ref_agent_part(ref_agents, id);
      break;
    case REF_AGENT_SUGGESTION:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_ENCLOSING:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_TERMINATED:
      *dest = ref_agent_home(ref_agents, id);
      break;
    case REF_AGENT_UNUSED:
    case REF_AGENT_NEW:
    case REF_AGENT_MODE_LAST:
      THROW("has no dest");
  }
  return REF_SUCCESS;
}